

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

BreakIterator * __thiscall
icu_63::RuleBasedBreakIterator::createBufferClone
          (RuleBasedBreakIterator *this,void *param_1,int32_t *bufferSize,UErrorCode *status)

{
  UErrorCode UVar1;
  int iVar2;
  undefined4 extraout_var;
  
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    if (*bufferSize != 0) {
      iVar2 = (*(this->super_BreakIterator).super_UObject._vptr_UObject[4])();
      UVar1 = U_SAFECLONE_ALLOCATED_WARNING;
      if ((BreakIterator *)CONCAT44(extraout_var,iVar2) == (BreakIterator *)0x0) {
        UVar1 = U_MEMORY_ALLOCATION_ERROR;
      }
      *status = UVar1;
      return (BreakIterator *)CONCAT44(extraout_var,iVar2);
    }
    *bufferSize = 1;
  }
  return (BreakIterator *)0x0;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }